

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_TwoLevelShm.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP5Writer::SendDataToAggregator(BP5Writer *this,BufferV *Data)

{
  size_type sVar1;
  MPIShmChain *pMVar2;
  reference pvVar3;
  MPIShmChain *this_00;
  long *in_RSI;
  long in_RDI;
  size_t n;
  ShmDataBuffer *b;
  size_t temp_offset;
  size_t block;
  size_t nBlocks;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> DataVec;
  MPIShmChain *a;
  MPIShmChain *in_stack_ffffffffffffff80;
  undefined8 local_78;
  size_t local_68;
  long local_48;
  ulong local_40;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> local_30;
  undefined8 local_18;
  long *local_10;
  
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x9d8) == 0) {
    local_78 = 0;
  }
  else {
    local_78 = __dynamic_cast(*(long *)(in_RDI + 0x9d8),&aggregator::MPIAggregator::typeinfo,
                              &aggregator::MPIShmChain::typeinfo,0);
  }
  local_18 = local_78;
  (**(code **)(*local_10 + 0x10))(&local_30);
  sVar1 = std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::size(&local_30);
  local_40 = 0;
  local_48 = 0;
  while (local_40 < sVar1) {
    pMVar2 = (MPIShmChain *)aggregator::MPIShmChain::LockProducerBuffer(in_stack_ffffffffffffff80);
    (pMVar2->super_MPIAggregator).m_SubStreams = 0;
    in_stack_ffffffffffffff80 = pMVar2;
    do {
      pvVar3 = std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::operator[]
                         (&local_30,local_40);
      local_68 = pvVar3->iov_len - local_48;
      if ((long)(pMVar2->super_MPIAggregator)._vptr_MPIAggregator -
          (pMVar2->super_MPIAggregator).m_SubStreams < local_68) {
        local_68 = (long)(pMVar2->super_MPIAggregator)._vptr_MPIAggregator -
                   (pMVar2->super_MPIAggregator).m_SubStreams;
      }
      this_00 = (MPIShmChain *)
                ((char *)(pMVar2->super_MPIAggregator).m_SubStreamIndex +
                (pMVar2->super_MPIAggregator).m_SubStreams);
      pvVar3 = std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::operator[]
                         (&local_30,local_40);
      memcpy(this_00,(void *)((long)pvVar3->iov_base + local_48),local_68);
      (pMVar2->super_MPIAggregator).m_SubStreams =
           local_68 + (pMVar2->super_MPIAggregator).m_SubStreams;
      pvVar3 = std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::operator[]
                         (&local_30,local_40);
      if (local_68 + local_48 < pvVar3->iov_len) {
        local_48 = local_68 + local_48;
      }
      else {
        local_48 = 0;
        local_40 = local_40 + 1;
      }
    } while (((_func_int **)(pMVar2->super_MPIAggregator).m_SubStreams <
              (pMVar2->super_MPIAggregator)._vptr_MPIAggregator) && (local_40 < sVar1));
    aggregator::MPIShmChain::UnlockProducerBuffer(this_00);
  }
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~vector
            ((vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)
             in_stack_ffffffffffffff80);
  return;
}

Assistant:

void BP5Writer::SendDataToAggregator(format::BufferV *Data)
{
    /* Only one process is running this function at once
       See shmFillerToken in the caller function

       In a loop, copy the local data into the shared memory, alternating
       between the two segments.
    */

    aggregator::MPIShmChain *a = dynamic_cast<aggregator::MPIShmChain *>(m_Aggregator);

    std::vector<core::iovec> DataVec = Data->DataVec();
    size_t nBlocks = DataVec.size();

    // size_t sent = 0;
    size_t block = 0;
    size_t temp_offset = 0;
    while (block < nBlocks)
    {
        // potentially blocking call waiting on Aggregator
        aggregator::MPIShmChain::ShmDataBuffer *b = a->LockProducerBuffer();
        // b->max_size: how much we can copy
        // b->actual_size: how much we actually copy
        b->actual_size = 0;
        while (true)
        {
            /* Copy n bytes from the current block, current offset to shm
                making sure to use up to shm_size bytes
            */
            size_t n = DataVec[block].iov_len - temp_offset;
            if (n > (b->max_size - b->actual_size))
            {
                n = b->max_size - b->actual_size;
            }
            std::memcpy(&b->buf[b->actual_size],
                        (const char *)DataVec[block].iov_base + temp_offset, n);
            b->actual_size += n;

            /* Have we processed the entire block or staying with it? */
            if (n + temp_offset < DataVec[block].iov_len)
            {
                temp_offset += n;
            }
            else
            {
                temp_offset = 0;
                ++block;
            }

            /* Have we reached the max allowed shm size ?*/
            if (b->actual_size >= b->max_size)
            {
                break;
            }
            if (block >= nBlocks)
            {
                break;
            }
        }
        // sent += b->actual_size;

        /*if (m_RankMPI >= 42)
        {
            std::cout << "Rank " << m_Comm.Rank()
                      << " filled shm, data_size = " << b->actual_size
                      << " block = " << block
                      << " temp offset = " << temp_offset << " sent = " << sent
                      << " buf = " << static_cast<void *>(b->buf) << " = "
                      << DoubleBufferToString((double *)b->buf,
                                              b->actual_size / sizeof(double))
                      << std::endl;
        }*/

        a->UnlockProducerBuffer();
    }
}